

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture1DArray::Texture1DArray(Texture1DArray *this)

{
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"vec2","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sampler1DArray","");
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0x8c18,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_020e05f8;
  (this->m_texture).super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>.
  m_data.ptr = (Texture1DArray *)0x0;
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture1DArray::Texture1DArray()
	: SupportedTextureType(GL_TEXTURE_1D_ARRAY, "vec2", "sampler1DArray")
{
}